

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  pointer pcVar1;
  BindingEnv *pBVar2;
  _Hash_node_base *p_Var3;
  FileReader *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  undefined8 uVar9;
  BindingEnv *this_00;
  _Rb_tree_header *p_Var10;
  long lVar11;
  ulong *puVar12;
  undefined **ppuVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string rel_path;
  string dir_err;
  string key;
  string prev_cwd;
  string parent_path;
  EvalString let_value;
  string path;
  EvalString eval;
  string local_1e8;
  uint local_1c4;
  Lexer *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string *local_198;
  ulong local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [32];
  size_t sStack_128;
  char *local_120;
  size_t sStack_118;
  BindingEnv *local_100;
  ManifestParserOptions local_f8;
  undefined1 local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  EvalString local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  EvalString local_48;
  
  uVar16 = CONCAT71(in_register_00000031,new_scope) & 0xffffffff;
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0 = &(this->super_Parser).lexer_;
  bVar5 = Lexer::ReadEvalString(local_1c0,&local_48,true,err);
  if (bVar5) {
    EvalString::Evaluate_abi_cxx11_(&local_68,&local_48,(Env *)this->env_);
    bVar5 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    if (bVar5) {
      local_198 = (string *)CONCAT44(local_198._4_4_,(int)CONCAT71(in_register_00000031,new_scope));
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = (this->env_->super_RelPathEnv).abs_path_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,
                 pcVar1 + (this->env_->super_RelPathEnv).abs_path_._M_string_length);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      local_188._M_string_length = 0;
      local_188.field_2._M_local_buf[0] = '\0';
      local_1c4 = (uint)CONCAT71((int7)((ulong)local_188._M_dataplus._M_p >> 8),1);
      local_190 = 0;
      do {
        bVar5 = Lexer::PeekToken(local_1c0,INDENT);
        if (!bVar5) goto LAB_0011d77a;
        local_148._0_8_ = local_148 + 0x10;
        local_148._8_8_ = (State *)0x0;
        local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
        local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar5 = ParseLet(this,(string *)local_148,&local_a8,err);
        iVar7 = 3;
        if (bVar5) {
          iVar6 = std::__cxx11::string::compare((char *)local_148);
          if (iVar6 != 0) {
            std::operator+(&local_1b8,"illegal key \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            puVar12 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1e8.field_2._M_allocated_capacity = *puVar12;
              local_1e8.field_2._8_8_ = plVar8[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar12;
              local_1e8._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1e8._M_string_length = plVar8[1];
            *plVar8 = (long)puVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            Lexer::Error(local_1c0,&local_1e8,err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar9 = local_1b8.field_2._M_allocated_capacity;
            _Var17._M_p = local_1b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_0011d47f;
LAB_0011d477:
            operator_delete(_Var17._M_p,uVar9 + 1);
            goto LAB_0011d47f;
          }
          if ((char)local_198 == '\0') {
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"invalid use of \'chdir\' in include line","");
            Lexer::Error(local_1c0,&local_1e8,err);
LAB_0011d464:
            uVar9 = local_1e8.field_2._M_allocated_capacity;
            _Var17._M_p = local_1e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) goto LAB_0011d47f;
            goto LAB_0011d477;
          }
          if ((local_190 & 1) != 0) {
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"duplicate \'chdir\' in subninja","");
            Lexer::Error(local_1c0,&local_1e8,err);
            goto LAB_0011d464;
          }
          EvalString::Evaluate_abi_cxx11_(&local_1e8,&local_a8,(Env *)this->env_);
          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1e8);
          paVar18 = &local_1e8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != paVar18) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          lVar11 = std::__cxx11::string::find((char *)&local_188,0x126c4e,0);
          if ((((lVar11 == 0) ||
               (lVar11 = std::__cxx11::string::find((char *)&local_188,0x126c48,0), lVar11 != -1))
              || (lVar11 = std::__cxx11::string::find((char *)&local_188,0x126c4d,0), lVar11 == 0))
             || (lVar11 = std::__cxx11::string::find((char *)&local_188,0x126c4c,0), lVar11 != -1))
          {
            local_1e8._M_dataplus._M_p = (pointer)paVar18;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"invalid use of \'.\' or \'..\' in chdir","");
            bVar5 = Lexer::Error(local_1c0,&local_1e8,err);
            uVar16 = (ulong)bVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != paVar18) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            iVar7 = 1;
          }
          else {
            pFVar4 = (this->super_Parser).file_reader_;
            iVar7 = (*pFVar4->_vptr_FileReader[4])(pFVar4,&local_e8,&local_168);
            if (iVar7 == 0) {
              pFVar4 = (this->super_Parser).file_reader_;
              iVar7 = (*pFVar4->_vptr_FileReader[3])(pFVar4,&local_188,&local_168);
              if (iVar7 == 0) {
                uVar9 = std::__cxx11::string::push_back((char)&local_188);
                local_190 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
                iVar7 = 0;
                goto LAB_0011d487;
              }
              std::operator+(&local_88,"Chdir to \'",&local_188);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              puVar12 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar12) {
                local_1b8.field_2._M_allocated_capacity = *puVar12;
                local_1b8.field_2._8_8_ = plVar8[3];
              }
              else {
                local_1b8.field_2._M_allocated_capacity = *puVar12;
                local_1b8._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_1b8._M_string_length = plVar8[1];
              *plVar8 = (long)puVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::operator+(&local_1e8,&local_1b8,&local_168);
              std::__cxx11::string::operator=((string *)err,(string *)&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
              uVar9 = local_88.field_2._M_allocated_capacity;
              _Var17._M_p = local_88._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_0011d74d;
            }
            else {
              std::operator+(&local_1e8,"Getcwd: ",&local_168);
              std::__cxx11::string::operator=((string *)err,(string *)&local_1e8);
              uVar9 = local_1e8.field_2._M_allocated_capacity;
              _Var17._M_p = local_1e8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_0011d74d:
                operator_delete(_Var17._M_p,uVar9 + 1);
              }
            }
            iVar7 = 1;
            uVar16 = 0;
          }
        }
        else {
LAB_0011d47f:
          local_1c4 = 0;
        }
LAB_0011d487:
        bVar14 = (byte)uVar16;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector(&local_a8.parsed_);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
      } while (iVar7 == 0);
      if (iVar7 == 3) {
LAB_0011d77a:
        uVar15 = local_1c4;
        if ((local_1c4 & 1) != 0) {
          local_148._8_8_ = (this->super_Parser).state_;
          local_148._16_8_ = (this->super_Parser).file_reader_;
          local_f8 = this->options_;
          local_148._24_8_ = 0;
          sStack_128 = 0;
          local_120 = (char *)0x0;
          sStack_118 = 0;
          local_148._0_8_ = &PTR_Parse_00132d70;
          local_f0 = 0;
          local_100 = &((State *)local_148._8_8_)->bindings_;
          if ((char)local_198 == '\0') {
            local_100 = this->env_;
          }
          else {
            this_00 = (BindingEnv *)operator_new(0xb0);
            pBVar2 = this->env_;
            std::operator+(&local_1e8,&local_c8,&local_188);
            RelPathEnv::RelPathEnv((RelPathEnv *)this_00,&local_188,&local_1e8);
            (this_00->super_RelPathEnv).super_Env._vptr_Env =
                 (_func_int **)&PTR__BindingEnv_00132cf0;
            p_Var10 = &(this_00->bindings_)._M_t._M_impl.super__Rb_tree_header;
            (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var10->_M_header;
            (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var10->_M_header;
            (this_00->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var10 = &(this_00->rules_)._M_t._M_impl.super__Rb_tree_header;
            (this_00->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (this_00->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (this_00->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var10->_M_header;
            (this_00->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var10->_M_header;
            (this_00->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            this_00->parent_ = pBVar2;
            local_100 = this_00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_188._M_string_length != 0) {
              BindingEnv::AddRule(local_100,&State::kPhonyRule);
              pBVar2 = local_100;
              for (p_Var3 = (((this->super_Parser).state_)->paths_)._M_h._M_before_begin._M_nxt;
                  p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
                paVar18 = &local_1e8.field_2;
                local_1e8._M_dataplus._M_p = (pointer)paVar18;
                local_198 = err;
                if (p_Var3[2]._M_nxt == (_Hash_node_base *)0x0) {
                  local_1e8._M_string_length = 0;
                  local_1e8.field_2._M_allocated_capacity =
                       local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1e8,p_Var3[1]._M_nxt,
                             (long)&(p_Var3[2]._M_nxt)->_M_nxt + (long)p_Var3[1]._M_nxt);
                }
                lVar11 = std::__cxx11::string::find
                                   ((char *)&local_1e8,
                                    (ulong)(pBVar2->super_RelPathEnv).abs_path_._M_dataplus._M_p,0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar18) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if (lVar11 == 0) {
                  Node::ResetEnv((Node *)p_Var3[3]._M_nxt,local_100);
                }
                err = local_198;
              }
            }
          }
          bVar5 = Parser::Load((Parser *)local_148,&local_68,err,local_1c0);
          uVar15 = 0;
          if (bVar5) {
            uVar15 = local_1c4 & 0xff;
          }
        }
        bVar14 = (byte)uVar15;
        if ((local_190 & 1) != 0) {
          pFVar4 = (this->super_Parser).file_reader_;
          iVar7 = (*pFVar4->_vptr_FileReader[3])(pFVar4,&local_e8,&local_168);
          if ((iVar7 != 0) && ((uVar15 & 1) != 0)) {
            std::operator+(&local_1b8,"restore cwd = \'",&local_e8);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            puVar12 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar12) {
              local_1e8.field_2._M_allocated_capacity = *puVar12;
              local_1e8.field_2._8_8_ = plVar8[3];
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar12;
              local_1e8._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1e8._M_string_length = plVar8[1];
            *plVar8 = (long)puVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1e8,(ulong)local_168._M_dataplus._M_p);
            ppuVar13 = (undefined **)(plVar8 + 2);
            if ((undefined **)*plVar8 == ppuVar13) {
              local_148._16_8_ = *ppuVar13;
              local_148._24_8_ = plVar8[3];
              local_148._0_8_ = local_148 + 0x10;
            }
            else {
              local_148._16_8_ = *ppuVar13;
              local_148._0_8_ = (undefined **)*plVar8;
            }
            local_148._8_8_ = plVar8[1];
            *plVar8 = (long)ppuVar13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::operator=((string *)err,(string *)local_148);
            if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
              operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar14 = 0;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                 local_188.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                 local_168.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar14 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar14 = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_48.parsed_);
  return (bool)(bVar14 & 1);
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  bool has_chdir = false;
  string parent_path = env_->AsString();
  string dir_err;
  string prev_cwd;
  string rel_path;
  bool ok = true;  // Always restore prev_cwd, even if there is an error.
  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString let_value;
    if (!ParseLet(&key, &let_value, err)) {
      ok = false;
      break;
    }
    if (key != "chdir") {
      lexer_.Error("illegal key '" + key + "' (only 'chdir' is supported)",
                   err);
      ok = false;
      break;
    }
    if (!new_scope) {
      lexer_.Error("invalid use of 'chdir' in include line", err);
      ok = false;
      break;
    }
    if (has_chdir) {
      lexer_.Error("duplicate 'chdir' in subninja", err);
      ok = false;
      break;
    }
    rel_path = let_value.Evaluate(env_);
    if (rel_path.find("./") == 0 || rel_path.find("/./") != string::npos ||
        rel_path.find("../") == 0 || rel_path.find("/../") != string::npos) {
      return lexer_.Error("invalid use of '.' or '..' in chdir", err);
    }
    if (file_reader_->Getcwd(&prev_cwd, &dir_err) != FileReader::Okay) {
      *err = "Getcwd: " + dir_err;
      return false;  // Can return because has_chdir is always false here.
    }
    if (file_reader_->Chdir(rel_path, &dir_err) != FileReader::Okay) {
      *err = "Chdir to '" + rel_path + "': " + dir_err;
      return false;
    }
    has_chdir = true;
    rel_path += '/';
  }

  if (ok) {
    ManifestParser subparser(state_, file_reader_, options_);
    if (new_scope) {
      // Note that rel_path of "" (for whatever reason) means no chdir.
      subparser.env_ = new BindingEnv(env_, rel_path,
                                      parent_path + rel_path);

      if (!rel_path.empty()) {
        subparser.env_->AddRule(&State::kPhonyRule);

        const string& abs_path = subparser.env_->AsString();
        // Find all inbound references to this chdir. Their env will be a parent
        // of subparser.env_ and assume no chdir. Replace it so that
        // subparser.env_ is used correctly with the chdir in place.
        for (State::Paths::iterator i = state_->paths_.begin();
            i != state_->paths_.end(); ++i) {
          if (i->first.AsString().find(abs_path) == 0) {
            Node* node = i->second;
            node->ResetEnv(subparser.env_);
          }
        }
      }
    } else {
      subparser.env_ = env_;
    }

    if (!subparser.Load(path, err, &lexer_)) {
      ok = false;
    }
  }

  // Restore prev_cwd. Note that has_chdir is set to true only after
  // file_reader_->Chdir() succeeds, and any errors after that set ok = false.
  // Do not smash the value of err if it was previously set.
  if (has_chdir) {
    if (file_reader_->Chdir(prev_cwd, &dir_err) != FileReader::Okay) {
      if (ok) {
        ok = false;
        *err = "restore cwd = '" + prev_cwd + "': " + dir_err;
      }
    }
  }
  return ok;
}